

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

int __thiscall nuraft::raft_server::shutdown(raft_server *this,int __fd,int __how)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  lock_guard<std::mutex> guard_1;
  lock_guard<std::mutex> l;
  unique_lock<std::mutex> commit_lock_1;
  unique_lock<std::mutex> commit_lock;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> params;
  mutex_type *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  atomic<bool> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  context *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  byte local_249;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  raft_server *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [40];
  string local_160 [32];
  raft_server *in_stack_fffffffffffffec0;
  string local_120 [40];
  string local_f8 [32];
  string local_d8 [48];
  string local_a8 [8];
  raft_server *in_stack_ffffffffffffff60;
  string local_88 [96];
  string local_28 [32];
  raft_server *local_8;
  
  local_8 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x273e78);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x273e9e);
      msg_if_given_abi_cxx11_((char *)local_28,"shutting down raft core");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1bf,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  cancel_global_requests
            ((raft_server *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x273f4e);
  nuraft::context::get_params(in_stack_fffffffffffffd98);
  peVar3 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x273f6b);
  if (((byte)peVar3[100] & 1) != 0) {
    snapshot_io_mgr::instance();
    snapshot_io_mgr::drop_reqs
              ((snapshot_io_mgr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8);
  }
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (mutex_type *)in_stack_fffffffffffffd78);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             SUB81((ulong)in_stack_fffffffffffffd78 >> 0x38,0));
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
            );
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x274066);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27409f);
      msg_if_given_abi_cxx11_((char *)local_88,"sent stop signal to the commit thread.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d2,local_88);
      std::__cxx11::string::~string(local_88);
    }
  }
  cancel_schedulers((raft_server *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x27418e);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2741c7);
      msg_if_given_abi_cxx11_((char *)local_a8,"cancelled all schedulers.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d8,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
  }
  while (bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffd88),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::this_thread::yield();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2742e5);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274318);
      msg_if_given_abi_cxx11_((char *)local_d8,"commit thread stopped.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e2,local_d8);
      std::__cxx11::string::~string(local_d8);
    }
  }
  drop_all_pending_commit_elems(in_stack_ffffffffffffff60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2743db);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27440e);
      msg_if_given_abi_cxx11_((char *)local_f8,"all pending commit elements dropped.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e6,local_f8);
      std::__cxx11::string::~string(local_f8);
    }
  }
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2744a5);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
             ,in_stack_fffffffffffffd78);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2744d2);
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2744f2);
  std::__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x274512);
  std::__shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x274532);
  std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x27454b);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x27457c);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2745af);
      msg_if_given_abi_cxx11_((char *)local_120,"reset all pointers.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1f0,local_120);
      std::__cxx11::string::~string(local_120);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->srv_to_join_);
  if (bVar1) {
    reset_srv_to_join((raft_server *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->srv_to_leave_);
  if (bVar1) {
    reset_srv_to_leave((raft_server *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
    ;
  }
  bVar1 = std::thread::joinable
                    ((thread *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2746e5);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274718);
      msg_if_given_abi_cxx11_(&stack0xfffffffffffffec0,"joined terminated commit thread.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1ff,&stack0xfffffffffffffec0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
    }
  }
  while( true ) {
    local_249 = 0;
    if (this->bg_append_ea_ != (EventAwaiter *)0x0) {
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffd88);
      local_249 = bVar1 ^ 0xff;
    }
    if ((local_249 & 1) == 0) break;
    EventAwaiter::invoke
              ((EventAwaiter *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::this_thread::yield();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x274821);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274854);
      msg_if_given_abi_cxx11_((char *)local_160,"sent stop signal to background append thread.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x206,local_160);
      std::__cxx11::string::~string(local_160);
    }
  }
  bVar1 = std::thread::joinable
                    ((thread *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  if (bVar1) {
    std::thread::join();
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
             ,in_stack_fffffffffffffd78);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x274952);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274985);
      sVar4 = std::__cxx11::
              list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
              ::size((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                      *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      msg_if_given_abi_cxx11_((char *)local_188,"clean up auto-forwarding queue: %zu elems",sVar4);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x20e,local_188);
      std::__cxx11::string::~string(local_188);
    }
  }
  std::__cxx11::
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::clear((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
           *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x274a59);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x274a8a);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274abd);
      msg_if_given_abi_cxx11_((char *)local_1a8,"clean up auto-forwarding clients");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x212,local_1a8);
      std::__cxx11::string::~string(local_1a8);
    }
  }
  cleanup_auto_fwd_pkgs(in_stack_fffffffffffffec0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x274b92);
    iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274bc5);
      msg_if_given_abi_cxx11_((char *)local_1c8,"raft_server shutdown completed.");
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x215,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x274c50);
  return extraout_EAX;
}

Assistant:

void raft_server::shutdown() {
    p_in("shutting down raft core");

    // If the global manager exists, cancel all pending requests.
    cancel_global_requests();

    // Cancel snapshot requests if exist.
    ptr<raft_params> params = ctx_->get_params();
    if (params->use_bg_thread_for_snapshot_io_) {
        snapshot_io_mgr::instance().drop_reqs(this);
    }

    // Terminate background commit thread.
    {   recur_lock(lock_);
        stopping_ = true;
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
    }

    p_in("sent stop signal to the commit thread.");

    // Cancel all scheduler tasks.
    // TODO: how do we guarantee all tasks are done?
    cancel_schedulers();

    p_in("cancelled all schedulers.");

    // Wait until background commit thread terminates.
    while (!commit_bg_stopped_) {
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
        std::this_thread::yield();
    }

    p_in("commit thread stopped.");

    drop_all_pending_commit_elems();

    p_in("all pending commit elements dropped.");

    // Clear shared_ptrs that the current server is holding.
    {   std::lock_guard<std::mutex> l(ctx_->ctx_lock_);
        ctx_->logger_.reset();
        ctx_->rpc_listener_.reset();
        ctx_->rpc_cli_factory_.reset();
        ctx_->scheduler_.reset();
    }

    p_in("reset all pointers.");

    // Server to join/leave.
    if (srv_to_join_) {
        reset_srv_to_join();
    }
    if (srv_to_leave_) {
        reset_srv_to_leave();
    }

    // Wait for BG commit thread.
    if (bg_commit_thread_.joinable()) {
        bg_commit_thread_.join();
    }

    p_in("joined terminated commit thread.");

    while (bg_append_ea_ && !append_bg_stopped_) {
        bg_append_ea_->invoke();
        std::this_thread::yield();
    }

    p_in("sent stop signal to background append thread.");

    if (bg_append_thread_.joinable()) {
        bg_append_thread_.join();
    }

    {
        auto_lock(auto_fwd_reqs_lock_);
        p_in("clean up auto-forwarding queue: %zu elems", auto_fwd_reqs_.size());
        auto_fwd_reqs_.clear();
    }

    p_in("clean up auto-forwarding clients");
    cleanup_auto_fwd_pkgs();

    p_in("raft_server shutdown completed.");
}